

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalEffects.cpp
# Opt level: O0

void __thiscall wasm::DiscardGlobalEffects::run(DiscardGlobalEffects *this,Module *module)

{
  PassOptions *pPVar1;
  Module *module_local;
  DiscardGlobalEffects *this_local;
  
  pPVar1 = Pass::getPassOptions(&this->super_Pass);
  std::
  __shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::reset(&(pPVar1->funcEffectsMap).
           super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
         );
  return;
}

Assistant:

void run(Module* module) override { getPassOptions().funcEffectsMap.reset(); }